

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O0

_Bool borg_flow_dark_reachable(int y,int x)

{
  _Bool _Var1;
  int x2;
  int y2;
  borg_grid *ag;
  int j;
  int x_local;
  int y_local;
  
  ag._0_4_ = 0;
  while( true ) {
    if (7 < (int)ag) {
      return false;
    }
    if ((borg_grids[y + ddy_ddd[(int)ag]][x + ddx_ddd[(int)ag]].feat != '\0') &&
       (_Var1 = borg_cave_floor_grid(borg_grids[y + ddy_ddd[(int)ag]] + (x + ddx_ddd[(int)ag])),
       _Var1)) break;
    ag._0_4_ = (int)ag + 1;
  }
  return true;
}

Assistant:

static bool borg_flow_dark_reachable(int y, int x)
{
    int j;

    borg_grid *ag;

    /* Scan neighbors */
    for (j = 0; j < 8; j++) {
        int y2 = y + ddy_ddd[j];
        int x2 = x + ddx_ddd[j];

        /* Get the grid */
        ag = &borg_grids[y2][x2];

        /* Skip unknown grids (important) */
        if (ag->feat == FEAT_NONE)
            continue;

        /* Accept known floor grids */
        if (borg_cave_floor_grid(ag))
            return true;
    }

    /* Failure */
    return false;
}